

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSExporter.cpp
# Opt level: O0

string * __thiscall
Assimp::(anonymous_namespace)::GetMaterialName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,aiMaterial *mat,uint index)

{
  int iVar1;
  aiReturn aVar2;
  char *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  undefined1 local_43c [8];
  aiString mat_name;
  char postfix [10];
  allocator local_1d;
  int32_t local_1c;
  aiMaterial *paStack_18;
  uint index_local;
  aiMaterial *mat_local;
  
  local_1c = (int32_t)mat;
  paStack_18 = (aiMaterial *)this;
  mat_local = (aiMaterial *)__return_storage_ptr__;
  if (GetMaterialName[abi:cxx11](aiMaterial_const&,unsigned_int)::underscore_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&GetMaterialName[abi:cxx11](aiMaterial_const&,unsigned_int)::
                                 underscore_abi_cxx11_);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)
                 &GetMaterialName[abi:cxx11](aiMaterial_const&,unsigned_int)::underscore_abi_cxx11_,
                 "_",&local_1d);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d);
      __cxa_atexit(std::__cxx11::string::~string,
                   &GetMaterialName[abi:cxx11](aiMaterial_const&,unsigned_int)::
                    underscore_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&GetMaterialName[abi:cxx11](aiMaterial_const&,unsigned_int)::
                           underscore_abi_cxx11_);
    }
  }
  memset(mat_name.data + 0x3fa,0,10);
  ASSIMP_itoa10<10ul>((char (*) [10])(mat_name.data + 0x3fa),local_1c);
  aiString::aiString((aiString *)local_43c);
  aVar2 = aiMaterial::Get(paStack_18,"?mat.name",0,0,(aiString *)local_43c);
  if (aVar2 == aiReturn_SUCCESS) {
    __lhs = aiString::C_Str((aiString *)local_43c);
    std::operator+(&local_460,__lhs,
                   &GetMaterialName[abi:cxx11](aiMaterial_const&,unsigned_int)::
                    underscore_abi_cxx11_);
    std::operator+(__return_storage_ptr__,&local_460,mat_name.data + 0x3fa);
    std::__cxx11::string::~string((string *)&local_460);
  }
  else {
    std::operator+(&local_480,"Material",
                   &GetMaterialName[abi:cxx11](aiMaterial_const&,unsigned_int)::
                    underscore_abi_cxx11_);
    std::operator+(__return_storage_ptr__,&local_480,mat_name.data + 0x3fa);
    std::__cxx11::string::~string((string *)&local_480);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetMaterialName(const aiMaterial& mat, unsigned int index) {
        static const std::string underscore = "_";
        char postfix[10] = {0};
        ASSIMP_itoa10(postfix, index);

        aiString mat_name;
        if (AI_SUCCESS == mat.Get(AI_MATKEY_NAME, mat_name)) {
            return mat_name.C_Str() + underscore + postfix;
        }

        return "Material" + underscore + postfix;
    }